

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

uint32_t __thiscall
cppnet::BufferQueue::GetFreeMemoryBlock
          (BufferQueue *this,vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *block_vec,
          uint32_t size)

{
  uint32_t uVar1;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *pvVar2;
  bool bVar3;
  element_type *peVar4;
  undefined1 local_f0 [32];
  Iovec local_d0;
  Iovec local_c0;
  undefined1 local_b0 [32];
  Iovec local_90;
  Iovec local_80;
  List<cppnet::BufferBlock> local_70;
  undefined1 local_48 [4];
  uint32_t cur_len;
  shared_ptr<cppnet::BufferBlock> temp;
  uint32_t mem_len_2;
  uint32_t mem_len_1;
  void *mem_2;
  void *mem_1;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *pvStack_18;
  uint32_t size_local;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *block_vec_local;
  BufferQueue *this_local;
  
  mem_2 = (void *)0x0;
  _mem_len_2 = (void *)0x0;
  temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0;
  temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       0;
  mem_1._4_4_ = size;
  pvStack_18 = block_vec;
  block_vec_local = (vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)this;
  std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::reserve(block_vec,8);
  std::shared_ptr<cppnet::BufferBlock>::shared_ptr
            ((shared_ptr<cppnet::BufferBlock> *)local_48,&this->_buffer_write);
  local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  if (mem_1._4_4_ == 0) {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
    if (!bVar3) {
      (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])();
      List<cppnet::BufferBlock>::GetTail((List<cppnet::BufferBlock> *)local_b0);
      std::shared_ptr<cppnet::BufferBlock>::operator=
                ((shared_ptr<cppnet::BufferBlock> *)local_48,
                 (shared_ptr<cppnet::BufferBlock> *)local_b0);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_b0)
      ;
    }
    while (bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48), bVar3) {
      peVar4 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      BufferBlock::GetFreeMemoryBlock
                (peVar4,&mem_2,
                 (uint32_t *)
                 ((long)&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4),(void **)&mem_len_2,
                 (uint32_t *)
                 &temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pvVar2 = pvStack_18;
      if (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._4_4_ != 0) {
        Iovec::Iovec(&local_c0,mem_2,
                     (ulong)temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_);
        std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                  (pvVar2,&local_c0);
        local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ =
             temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._4_4_ +
             local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_;
      }
      pvVar2 = pvStack_18;
      if ((uint)temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != 0) {
        Iovec::Iovec(&local_d0,_mem_len_2,
                     (ulong)(uint)temp.
                                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi);
        std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                  (pvVar2,&local_d0);
        local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ =
             (uint)temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi +
             local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_;
      }
      List<cppnet::BufferBlock>::GetTail((List<cppnet::BufferBlock> *)(local_f0 + 0x10));
      bVar3 = std::operator==((shared_ptr<cppnet::BufferBlock> *)local_48,
                              (shared_ptr<cppnet::BufferBlock> *)(local_f0 + 0x10));
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                ((shared_ptr<cppnet::BufferBlock> *)(local_f0 + 0x10));
      if (bVar3) break;
      std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_48);
      ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_f0);
      std::shared_ptr<cppnet::BufferBlock>::operator=
                ((shared_ptr<cppnet::BufferBlock> *)local_48,
                 (shared_ptr<cppnet::BufferBlock> *)local_f0);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_f0)
      ;
    }
  }
  else {
    while (local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ < mem_1._4_4_) {
      bVar3 = std::operator==((shared_ptr<cppnet::BufferBlock> *)local_48,(nullptr_t)0x0);
      if (bVar3) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])();
        List<cppnet::BufferBlock>::GetTail(&local_70);
        std::shared_ptr<cppnet::BufferBlock>::operator=
                  ((shared_ptr<cppnet::BufferBlock> *)local_48,
                   (shared_ptr<cppnet::BufferBlock> *)&local_70);
        std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                  ((shared_ptr<cppnet::BufferBlock> *)&local_70);
      }
      peVar4 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      BufferBlock::GetFreeMemoryBlock
                (peVar4,&mem_2,
                 (uint32_t *)
                 ((long)&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4),(void **)&mem_len_2,
                 (uint32_t *)
                 &temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pvVar2 = pvStack_18;
      if (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._4_4_ != 0) {
        Iovec::Iovec(&local_80,mem_2,
                     (ulong)temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_);
        std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                  (pvVar2,&local_80);
        local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ =
             temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._4_4_ +
             local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_;
      }
      pvVar2 = pvStack_18;
      if ((uint)temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != 0) {
        Iovec::Iovec(&local_90,_mem_len_2,
                     (ulong)(uint)temp.
                                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi);
        std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                  (pvVar2,&local_90);
        local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ =
             (uint)temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi +
             local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_;
      }
      std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_48);
      ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)(local_b0 + 0x10));
      std::shared_ptr<cppnet::BufferBlock>::operator=
                ((shared_ptr<cppnet::BufferBlock> *)local_48,
                 (shared_ptr<cppnet::BufferBlock> *)(local_b0 + 0x10));
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                ((shared_ptr<cppnet::BufferBlock> *)(local_b0 + 0x10));
    }
  }
  uVar1 = local_70._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_;
  std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_48);
  return uVar1;
}

Assistant:

uint32_t BufferQueue::GetFreeMemoryBlock(std::vector<Iovec>& block_vec, uint32_t size) {
    void* mem_1 = nullptr;
    void* mem_2 = nullptr;
    uint32_t mem_len_1 = 0;
    uint32_t mem_len_2 = 0;

    block_vec.reserve(__block_vec_default_size);
    std::shared_ptr<BufferBlock> temp = _buffer_write;
    uint32_t cur_len = 0;
    if (size > 0) {
        while (cur_len < size) {
            if (temp == nullptr) {
                Append();
                temp = _buffer_list.GetTail();
            }
        
            temp->GetFreeMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
            if (mem_len_1 > 0) {
                block_vec.emplace_back(Iovec(mem_1, mem_len_1));
                cur_len += mem_len_1;
            }
            if (mem_len_2 > 0) {
                block_vec.emplace_back(Iovec(mem_2, mem_len_2));
                cur_len += mem_len_2;
            }
            temp = temp->GetNext();
        }

    } else {
        // add one block
        if (!temp) {
            Append();
            temp = _buffer_list.GetTail();
        }
        
        while (temp) {
            temp->GetFreeMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
            if (mem_len_1 > 0) {
                block_vec.emplace_back(Iovec(mem_1, mem_len_1));
                cur_len += mem_len_1;
            }
            if (mem_len_2 > 0) {
                block_vec.emplace_back(Iovec(mem_2, mem_len_2));
                cur_len += mem_len_2;
            }
            if (temp == _buffer_list.GetTail()) {
                break;
            }
            temp = temp->GetNext();
        }
    }
    return cur_len;
}